

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logging.h
# Opt level: O0

void __thiscall LogMessage::LogMessage(LogMessage *this,char *file,int line)

{
  ostream *poVar1;
  int in_EDX;
  char *in_RSI;
  LogMessage *in_RDI;
  
  in_RDI->flushed_ = false;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&in_RDI->str_);
  poVar1 = stream(in_RDI);
  poVar1 = std::operator<<(poVar1,in_RSI);
  poVar1 = std::operator<<(poVar1,":");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,in_EDX);
  std::operator<<(poVar1,": ");
  return;
}

Assistant:

LogMessage(const char* file, int line)
      : flushed_(false) {
    stream() << file << ":" << line << ": ";
  }